

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt_signal.cpp
# Opt level: O0

int main(void)

{
  Exception *ex;
  function<void_(int)> local_470;
  undefined1 local_440 [8];
  Signal signal;
  Loop loop;
  
  uv::Signal::Signal((Signal *)local_440);
  uv::Loop::init((Loop *)&signal.startHandler_._M_invoker,(EVP_PKEY_CTX *)0x0);
  uv::Signal::init((Signal *)local_440,(EVP_PKEY_CTX *)&signal.startHandler_._M_invoker);
  std::function<void(int)>::function<main::__0,void>
            ((function<void(int)> *)&local_470,(anon_class_1_0_00000001 *)((long)&ex + 7));
  uv::Signal::start((Signal *)local_440,&local_470,2);
  std::function<void_(int)>::~function(&local_470);
  uv::Loop::run((Loop *)&signal.startHandler_._M_invoker);
  uv::Signal::~Signal((Signal *)local_440);
  uv::Loop::~Loop((Loop *)&signal.startHandler_._M_invoker);
  return 0;
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Signal signal;

	try {
		loop.init();
		signal.init(loop);

		signal.start([](int signum) {
			std::cout << "Ctrl+C中断,信号量值为:" << signum << std::endl;
		}, SIGINT);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}